

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<int,char_const(&)[2]>
                   (string *__return_storage_ptr__,int *arg,char (*args) [2])

{
  size_type *psVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  allocator local_51;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  string local_30;
  
  StringBuilder<int>(&local_30,arg);
  std::__cxx11::string::string((string *)&local_50,*args,&local_51);
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    uVar3 = local_30.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_48 + local_30._M_string_length) {
    uVar4 = 0xf;
    if (local_50 != local_40) {
      uVar4 = local_40[0];
    }
    if (local_48 + local_30._M_string_length <= uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_30._M_dataplus._M_p);
      goto LAB_0011fe85;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_30,(ulong)local_50);
LAB_0011fe85:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar3 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}